

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

void __thiscall
dlib::tensor::
add_to_sample<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_trans<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>>
          (tensor *this,unsigned_long_long idx,
          matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_trans<dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>_>_>
          *item)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  fatal_error *pfVar3;
  string local_1b0;
  ostringstream dlib_o_out;
  uint auStack_178 [88];
  
  if ((ulong)this->m_n <= idx) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xab);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::tensor::add_to_sample(unsigned long long, const matrix_exp<EXP> &) [EXP = dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_trans<dlib::matrix<float>>>>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"idx < (unsigned long long)num_samples()");
    std::operator<<(poVar2,".\n");
    *(uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -6)) =
         *(uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -6)) | 1;
    poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar2,"\n");
    pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
  }
  if (*(long *)(**(long **)(item + 8) + 8) * *(long *)(*(long *)item + 8) -
      this->m_nc * this->m_nr * this->m_k == 0) {
    iVar1 = (*this->_vptr_tensor[3])();
    _dlib_o_out = (float *)(CONCAT44(extraout_var,iVar1) +
                           idx * *(long *)(*(long *)item + 8) * *(long *)(**(long **)(item + 8) + 8)
                           * 4);
    assignable_ptr_matrix<float>::operator+=((assignable_ptr_matrix<float> *)&dlib_o_out,item);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xac);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "void dlib::tensor::add_to_sample(unsigned long long, const matrix_exp<EXP> &) [EXP = dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix_op<dlib::op_trans<dlib::matrix<float>>>>]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"item.size() == nr()*nc()*k()");
  std::operator<<(poVar2,".\n");
  *(uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -6)) =
       *(uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -6)) | 1;
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar2,"\n");
  pfVar3 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar3,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(pfVar3,&fatal_error::typeinfo,error::~error);
}

Assistant:

void add_to_sample (
            unsigned long long idx,
            const matrix_exp<EXP>& item
        )
        {
            DLIB_CASSERT(idx < (unsigned long long)num_samples());
            DLIB_CASSERT(item.size() == nr()*nc()*k());
            static_assert((is_same_type<float, typename EXP::type>::value == true),
                "To assign a matrix to a tensor the matrix must contain float values");
            set_ptrm(host()+idx*item.size(), item.nr(), item.nc()) += item;
        }